

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_SAMTBackwardApplyComma_Test::~LabelTests_SAMTBackwardApplyComma_Test
          (LabelTests_SAMTBackwardApplyComma_Test *this)

{
  LabelTests_SAMTBackwardApplyComma_Test *this_local;
  
  ~LabelTests_SAMTBackwardApplyComma_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LabelTests, SAMTBackwardApplyComma) {
  auto t = readTree("(ROOT (, foo) bar)");
  ASSERT_EQ(2, t.size());
  Span root{0, 2};
  EXPECT_EQ(root, t.front().span);
  root.end = 1;
  EXPECT_EQ(root, t.back().span);
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("ROOT\\COMMA", sl(SpanPair{{}, { 1, 2 }}));
}